

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O2

bool __thiscall
ON_BinaryArchive::ReadLinetypeSegment(ON_BinaryArchive *this,ON_LinetypeSegment *seg)

{
  undefined8 uVar1;
  undefined8 uVar2;
  bool bVar3;
  uint in_EAX;
  eSegType eVar4;
  uint uVar5;
  uint uStack_28;
  uint i;
  
  uVar1 = ON_LinetypeSegment::OneMillimeterLine._8_8_;
  seg->m_length = ON_LinetypeSegment::OneMillimeterLine.m_length;
  uVar2 = ON_LinetypeSegment::OneMillimeterLine._8_8_;
  ON_LinetypeSegment::OneMillimeterLine.m_seg_type = (eSegType)uVar1;
  ON_LinetypeSegment::OneMillimeterLine.m_reserved2 = SUB84(uVar1,4);
  uVar5 = ON_LinetypeSegment::OneMillimeterLine.m_reserved2;
  seg->m_seg_type = ON_LinetypeSegment::OneMillimeterLine.m_seg_type;
  ON_LinetypeSegment::OneMillimeterLine._8_8_ = uVar2;
  seg->m_reserved2 = uVar5;
  uStack_28 = in_EAX;
  bVar3 = ReadDouble(this,&seg->m_length);
  if (bVar3) {
    _uStack_28 = (ulong)uStack_28;
    bVar3 = ReadInt(this,&i);
    if (i == 0xffffffff) {
      _uStack_28 = _uStack_28 & 0xffffffff;
      uVar5 = 0;
    }
    else if (i == 1) {
      _uStack_28 = CONCAT44(2,uStack_28);
      uVar5 = 2;
    }
    else {
      uVar5 = i;
      if (i == 0) {
        _uStack_28 = CONCAT44(1,uStack_28);
        uVar5 = 1;
      }
    }
    eVar4 = ON_LinetypeSegment::SegmentTypeFromUnsigned(uVar5);
    seg->m_seg_type = eVar4;
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool ON_BinaryArchive::ReadLinetypeSegment(ON_LinetypeSegment& seg)
{
  seg = ON_LinetypeSegment::OneMillimeterLine;
  bool rc = ReadDouble(&seg.m_length);
  if (rc)
  {
    // ON_LinetypeSegment::eSegType::Unset was not added initialy, so juggling values is required for
    // Unset, stLine and stSpace.  Any future values with work without
    // juggling.
    unsigned int i = 0;
    rc = ReadInt(&i);
    switch (i)
    {
    case 0:
      i = static_cast<unsigned int>(ON_LinetypeSegment::eSegType::stLine);
      break;
    case 1:
      i = static_cast<unsigned int>(ON_LinetypeSegment::eSegType::stSpace);
      break;
    case ON_UNSET_UINT_INDEX:
      i = static_cast<unsigned int>(ON_LinetypeSegment::eSegType::Unset);
      break;
    }
    seg.m_seg_type = ON_LinetypeSegment::SegmentTypeFromUnsigned(i);
  }
  return rc;
}